

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.h
# Opt level: O2

void __thiscall
dynamicgraph::SignalPtr<double,_int>::setConstantDefault(SignalPtr<double,_int> *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_SignalPtr[0xd])();
  setConstantDefault(this,(double *)CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

virtual inline void setConstantDefault() { setConstantDefault(accessCopy()); }